

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMap.c
# Opt level: O1

void Nwk_ManSetIfParsDefault(If_Par_t *pPars)

{
  memset(pPars,0,0x130);
  pPars->nLutSize = 6;
  pPars->nCutsMax = 8;
  pPars->nFlowIters = 1;
  pPars->nAreaIters = 2;
  pPars->DelayTarget = -1.0;
  pPars->Epsilon = 0.005;
  pPars->fPreprocess = 1;
  pPars->fArea = 0;
  pPars->fFancy = 0;
  pPars->fExpRed = 1;
  pPars->fLatchPaths = 0;
  pPars->fEdge = 1;
  pPars->fPower = 0;
  pPars->fCutMin = 0;
  pPars->fVerbose = 0;
  pPars->fTruth = 0;
  pPars->nLatchesCi = 0;
  pPars->nLatchesCo = 0;
  pPars->fLiftLeaves = 0;
  pPars->pFuncCost = (_func_int_If_Man_t_ptr_If_Cut_t_ptr *)0x0;
  pPars->pLutLib = (If_LibLut_t *)0x0;
  pPars->pTimesArr = (float *)0x0;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Load the network into FPGA manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Nwk_ManSetIfParsDefault( If_Par_t * pPars )
{
//    extern void * Abc_FrameReadLibLut();
    // set defaults
    memset( pPars, 0, sizeof(If_Par_t) );
    // user-controlable paramters
//    pPars->nLutSize    = -1;
    pPars->nLutSize    =  6;
    pPars->nCutsMax    =  8;
    pPars->nFlowIters  =  1;
    pPars->nAreaIters  =  2;
    pPars->DelayTarget = -1;
    pPars->Epsilon     =  (float)0.005;
    pPars->fPreprocess =  1;
    pPars->fArea       =  0;
    pPars->fFancy      =  0;
    pPars->fExpRed     =  1; ////
    pPars->fLatchPaths =  0;
    pPars->fEdge       =  1;
    pPars->fPower      =  0;
    pPars->fCutMin     =  0;
    pPars->fVerbose    =  0;
    // internal parameters
    pPars->fTruth      =  0;
    pPars->nLatchesCi  =  0;
    pPars->nLatchesCo  =  0;
    pPars->fLiftLeaves =  0;
//    pPars->pLutLib     =  Abc_FrameReadLibLut();
    pPars->pLutLib     =  NULL;
    pPars->pTimesArr   =  NULL; 
    pPars->pTimesArr   =  NULL;   
    pPars->pFuncCost   =  NULL;   
/*
    if ( pPars->nLutSize == -1 )
    {
        if ( pPars->pLutLib == NULL )
        {
            printf( "The LUT library is not given.\n" );
            return;
        }
        // get LUT size from the library
        pPars->nLutSize = pPars->pLutLib->LutMax;
    }
*/
}